

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void tests::to_dot(void)

{
  NS *graph;
  N *this;
  N *this_00;
  N *this_01;
  N *this_02;
  N *this_03;
  N *this_04;
  N *this_05;
  N *this_06;
  N *this_07;
  N *this_08;
  N *this_09;
  ostream *poVar1;
  _Vector_base<N_*,_std::allocator<N_*>_> *this_10;
  int __fd;
  Alg<void> local_b8;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> viewed;
  _Vector_base<N_*,_std::allocator<N_*>_> local_68;
  _Vector_base<N_*,_std::allocator<N_*>_> local_48;
  
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this,"p");
  this_00 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_00,"has instance");
  this_01 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_01,"p1");
  this_02 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_02,"p2");
  this_03 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_03,"A");
  this_04 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_04,"B");
  this_05 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_05,"C");
  this_06 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_06,"D");
  this_07 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_07,"BA");
  this_08 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_08,"BB");
  this_09 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(this_09,"BBB");
  viewed._M_t._M_impl._0_8_ = this_01;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_02;
  N::connect(this,(int)this_00,(sockaddr *)&viewed,2);
  viewed._M_t._M_impl._0_8_ = this_06;
  N::connect(this_03,(int)this_02,(sockaddr *)&viewed,1);
  __fd = (int)this_01;
  viewed._M_t._M_impl._0_8_ = this_04;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_05;
  N::connect(this_03,__fd,(sockaddr *)&viewed,2);
  viewed._M_t._M_impl._0_8_ = this_07;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = this_08;
  N::connect(this_04,__fd,(sockaddr *)&viewed,2);
  viewed._M_t._M_impl._0_8_ = this_09;
  N::connect(this_08,__fd,(sockaddr *)&viewed,1);
  viewed._M_t._M_impl._0_8_ = this_09;
  N::connect(this_08,(int)this_02,(sockaddr *)&viewed,1);
  viewed._M_t._M_impl._0_8_ = this_04;
  N::connect(this_09,__fd,(sockaddr *)&viewed,1);
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &viewed._M_t._M_impl.super__Rb_tree_header._M_header;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       viewed._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  viewed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       viewed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  poVar1 = std::operator<<((ostream *)&std::cout,"digraph T {");
  std::endl<char,std::char_traits<char>>(poVar1);
  alg::dot((ostream *)&std::cout,&viewed);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  N::histo(this_03,&local_b8,(vector<N_*,_std::allocator<N_*>_> *)&local_48);
  std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(&local_48);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  alg::dot((ostream *)&std::cout,&viewed);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  N::histo(this,&local_b8,(vector<N_*,_std::allocator<N_*>_> *)&local_68);
  std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(&local_68);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  poVar1 = std::operator<<((ostream *)&std::cout,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  this_10 = (_Vector_base<N_*,_std::allocator<N_*>_> *)NS::clear(graph);
  if (this_10 != (_Vector_base<N_*,_std::allocator<N_*>_> *)0x0) {
    std::_Vector_base<N_*,_std::allocator<N_*>_>::~_Vector_base(this_10);
  }
  operator_delete(this_10,0x18);
  std::_Rb_tree<N_*,_N_*,_std::_Identity<N_*>,_std::less<N_*>,_std::allocator<N_*>_>::~_Rb_tree
            (&viewed._M_t);
  return;
}

Assistant:

void to_dot() {
        auto g = new NS();

        auto p = new(g) N("p"), has = new(g) N("has instance");
        auto p1 = new(g) N("p1"), p2 = new(g) N("p2");
        auto n1 = new(g) N("A"), n2 = new(g) N("B"), n3 = new(g) N("C"), n4 = new(g) N("D");
        auto n5 = new(g) N("BA"), n6 = new(g) N("BB");
        auto n7 = new(g) N("BBB");

        p->connect(has, {p1, p2});

        n1->connect(p2, {n4});
        n1->connect(p1, {n2, n3});
        n2->connect(p1, {n5, n6});
        n6->connect(p1, {n7});
        n6->connect(p2, {n7});

        n7->connect(p1, {n2});

        std::set<N*> viewed;
        cout << "digraph T {" << endl;
        n1->histo(alg::dot(cout, viewed));
        p->histo(alg::dot(cout, viewed));
        cout << "}" << endl;

        delete g->clear();
    }